

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O0

void __thiscall xercesc_4_0::AbstractDOMParser::parse(AbstractDOMParser *this,InputSource *source)

{
  IOException *this_00;
  XMLSize_t XVar1;
  DOMDocument *pDVar2;
  OutOfMemoryException *anon_var_0;
  DOMDocument *doc;
  undefined1 local_40 [8];
  ResetInProgressType resetInProgress;
  InputSource *source_local;
  AbstractDOMParser *this_local;
  
  if ((this->fParseInProgress & 1U) == 0) {
    JanitorMemFunCall<xercesc_4_0::AbstractDOMParser>::JanitorMemFunCall
              ((JanitorMemFunCall<xercesc_4_0::AbstractDOMParser> *)local_40,this,
               (MFPT)AbstractDOMParser::resetInProgress);
    this->fParseInProgress = true;
    (*(this->fScanner->super_XMLBufferFullHandler)._vptr_XMLBufferFullHandler[7])
              (this->fScanner,source);
    if ((((this->fDoXInclude & 1U) != 0) && (XVar1 = getErrorCount(this), XVar1 == 0)) &&
       (pDVar2 = getDocument(this), pDVar2 != (DOMDocument *)0x0)) {
      (*(pDVar2->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x20])();
    }
    JanitorMemFunCall<xercesc_4_0::AbstractDOMParser>::~JanitorMemFunCall
              ((JanitorMemFunCall<xercesc_4_0::AbstractDOMParser> *)local_40);
    return;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x30);
  IOException::IOException
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/parsers/AbstractDOMParser.cpp"
             ,0x224,Gen_ParseInProgress,this->fMemoryManager);
  __cxa_throw(this_00,&IOException::typeinfo,IOException::~IOException);
}

Assistant:

void AbstractDOMParser::parse(const InputSource& source)
{
    // Avoid multiple entrance
    if (fParseInProgress)
        ThrowXMLwithMemMgr(IOException, XMLExcepts::Gen_ParseInProgress, fMemoryManager);

    ResetInProgressType     resetInProgress(this, &AbstractDOMParser::resetInProgress);

    try
    {
        fParseInProgress = true;
        fScanner->scanDocument(source);

        if (fDoXInclude && getErrorCount()==0){
		    DOMDocument *doc = getDocument();
            // after XInclude, the document must be normalized
            if(doc)
            	doc->normalizeDocument();
        }
    }
    catch(const OutOfMemoryException&)
    {
        resetInProgress.release();

        throw;
    }
}